

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void snap_useuv(GCproto *pt,uint8_t *udf)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  
  if (((pt->flags & 1) != 0) && (uVar2 = pt->sizekgc, (ulong)uVar2 != 0)) {
    uVar3 = (ulong)(pt->k).ptr32;
    uVar4 = 0;
    do {
      uVar5 = (ulong)*(uint *)(uVar3 - 4);
      if (*(char *)(uVar5 + 5) == '\a') {
        bVar6 = *(byte *)(uVar5 + 0x24);
        if (bVar6 != 0) {
          uVar7 = 0;
          do {
            sVar1 = *(short *)((ulong)*(uint *)(uVar5 + 0x14) + uVar7 * 2);
            if (sVar1 < 0) {
              udf[(byte)sVar1] = '\0';
              bVar6 = *(byte *)(uVar5 + 0x24);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < bVar6);
        }
      }
      uVar3 = uVar3 - 4;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void snap_useuv(GCproto *pt, uint8_t *udf)
{
  /* This is a coarse check, because it's difficult to correlate the lifetime
  ** of slots and closures. But the number of false positives is quite low.
  ** A false positive may cause a slot not to be purged, which is just
  ** a missed optimization.
  */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, j, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO) {
	for (j = 0; j < gco2pt(o)->sizeuv; j++) {
	  uint32_t v = proto_uv(gco2pt(o))[j];
	  if ((v & PROTO_UV_LOCAL)) {
	    udf[(v & 0xff)] = 0;
	  }
	}
      }
    }
  }
}